

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O2

void * worker_start(void *thr_ptr)

{
  mythread_mutex *mutex;
  mythread_cond *cond;
  lzma_block *block;
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  char cVar9;
  lzma_ret lVar10;
  lzma_vli lVar11;
  size_t in_size;
  lzma_next_coder *next;
  size_t sVar12;
  bool bVar13;
  uint uVar14;
  long local_58;
  ulong local_50;
  long *local_48;
  lzma_next_coder *local_40;
  void *local_38;
  
  mutex = (mythread_mutex *)((long)thr_ptr + 0x160);
  cond = (mythread_cond *)((long)thr_ptr + 0x188);
  local_48 = (long *)((long)thr_ptr + 0x30);
  block = (lzma_block *)((long)thr_ptr + 0x88);
  local_38 = (void *)((long)thr_ptr + 0xb0);
  next = (lzma_next_coder *)((long)thr_ptr + 0x40);
  bVar13 = true;
  uVar14 = 0;
  local_40 = next;
LAB_0018fd4c:
  if (!bVar13) {
    mythread_mutex_unlock(mutex);
    if (uVar14 == 0) {
      __assert_fail("state != THR_IDLE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0x172,"void *worker_start(void *)");
    }
    if (uVar14 == 3) {
      __assert_fail("state != THR_STOP",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0x173,"void *worker_start(void *)");
    }
    if (2 < uVar14) goto LAB_00190048;
    if (*local_48 != 0) {
      __assert_fail("thr->progress_in == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0xc9,"worker_state worker_encode(worker_thread *, worker_state)");
    }
    if (*(long *)((long)thr_ptr + 0x38) != 0) {
      __assert_fail("thr->progress_out == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0xca,"worker_state worker_encode(worker_thread *, worker_state)");
    }
    lVar2 = *(long *)((long)thr_ptr + 0x20);
    uVar1 = *(undefined4 *)(lVar2 + 0xc0);
    uVar3 = *(undefined8 *)(lVar2 + 0x110);
    uVar4 = *(undefined8 *)(lVar2 + 8);
    *(undefined8 *)((long)thr_ptr + 0x88) = 0;
    *(undefined4 *)((long)thr_ptr + 0x90) = uVar1;
    *(undefined4 *)((long)thr_ptr + 0x94) = 0;
    *(undefined8 *)((long)thr_ptr + 0x98) = uVar3;
    *(undefined8 *)((long)thr_ptr + 0xa0) = uVar4;
    *(long *)((long)thr_ptr + 0xa8) = lVar2 + 0x10;
    memset(local_38,0,0xa8);
    lVar10 = lzma_block_header_size(block);
    if ((lVar10 == LZMA_OK) &&
       (lVar10 = lzma_block_encoder_init(next,*(lzma_allocator **)((long)thr_ptr + 0x28),block),
       lVar10 == LZMA_OK)) {
      local_58 = 0;
      *(ulong *)(*(long *)((long)thr_ptr + 0x18) + 8) = (ulong)*(uint *)((long)thr_ptr + 0x8c);
      local_50 = *(ulong *)(*(long *)((long)thr_ptr + 0x20) + 0x110);
      bVar8 = true;
      in_size = 0;
      do {
        if (!bVar8) {
          mythread_mutex_unlock(mutex);
          uVar7 = local_50;
          next = local_40;
          if (2 < uVar14) goto LAB_00190048;
          cVar9 = (uVar14 == 2) * '\x03';
          sVar12 = in_size;
          if (0x4000 < in_size - local_58) {
            cVar9 = '\0';
            sVar12 = local_58 + 0x4000;
          }
          lVar10 = (**(code **)((long)thr_ptr + 0x58))
                             (*(undefined8 *)((long)thr_ptr + 0x40),
                              *(undefined8 *)((long)thr_ptr + 0x28),
                              *(undefined8 *)((long)thr_ptr + 8),&local_58,sVar12,
                              **(undefined8 **)((long)thr_ptr + 0x18),
                              *(undefined8 **)((long)thr_ptr + 0x18) + 1,local_50,cVar9);
          if (lVar10 != LZMA_OK) {
            if (lVar10 != LZMA_STREAM_END) goto LAB_0018ff96;
            if (uVar14 != 2) {
              __assert_fail("state == THR_FINISH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                            ,0x11d,"worker_state worker_encode(worker_thread *, worker_state)");
            }
            lVar10 = lzma_block_header_encode
                               (block,(uint8_t *)**(undefined8 **)((long)thr_ptr + 0x18));
            if (lVar10 != LZMA_OK) goto LAB_0018ff96;
            goto LAB_0019001b;
          }
          if (uVar7 <= *(ulong *)(*(long *)((long)thr_ptr + 0x18) + 8)) goto LAB_0018ffa2;
        }
        mythread_mutex_lock(mutex);
        bVar8 = true;
LAB_0018ff1c:
        if (bVar8) {
          *(long *)((long)thr_ptr + 0x30) = local_58;
          *(undefined8 *)((long)thr_ptr + 0x38) =
               *(undefined8 *)(*(long *)((long)thr_ptr + 0x18) + 8);
          while( true ) {
            uVar14 = *thr_ptr;
            if (in_size != *(size_t *)((long)thr_ptr + 0x10)) break;
            if (uVar14 != 1) {
              bVar8 = false;
              goto LAB_0018ff1c;
            }
            mythread_cond_wait(cond,mutex);
          }
          bVar8 = false;
          in_size = *(size_t *)((long)thr_ptr + 0x10);
          goto LAB_0018ff1c;
        }
        bVar8 = false;
      } while( true );
    }
    worker_error((worker_thread *)thr_ptr,lVar10);
    uVar14 = 3;
    goto LAB_00190052;
  }
  mythread_mutex_lock(mutex);
  bVar8 = true;
  while (bVar8) {
    while( true ) {
      uVar14 = *thr_ptr;
      if (uVar14 == 3) {
        *(undefined4 *)thr_ptr = 0;
        mythread_cond_signal(cond);
        uVar14 = *thr_ptr;
      }
      if (uVar14 != 0) break;
      mythread_cond_wait(cond,mutex);
    }
    bVar8 = false;
  }
  goto LAB_001900ec;
LAB_0018ffa2:
  bVar8 = true;
  while (bVar8) {
    mythread_mutex_lock(mutex);
    bVar8 = true;
    while (bVar8) {
      while (uVar14 = *thr_ptr, uVar14 == 1) {
        mythread_cond_wait(cond,mutex);
      }
      in_size = *(size_t *)((long)thr_ptr + 0x10);
      bVar8 = false;
    }
    bVar8 = false;
  }
  mythread_mutex_unlock(mutex);
  next = local_40;
  if (uVar14 < 3) {
    puVar5 = *(undefined8 **)((long)thr_ptr + 0x18);
    puVar5[1] = 0;
    lVar10 = lzma_block_uncomp_encode
                       (block,*(uint8_t **)((long)thr_ptr + 8),in_size,(uint8_t *)*puVar5,puVar5 + 1
                        ,local_50);
    if (lVar10 == LZMA_OK) {
LAB_0019001b:
      lVar11 = lzma_block_unpadded_size(block);
      lVar2 = *(long *)((long)thr_ptr + 0x18);
      *(lzma_vli *)(lVar2 + 0x10) = lVar11;
      if (lVar11 == 0) {
        __assert_fail("thr->outbuf->unpadded_size != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                      ,0x152,"worker_state worker_encode(worker_thread *, worker_state)");
      }
      *(undefined8 *)(lVar2 + 0x18) = *(undefined8 *)((long)thr_ptr + 0xa0);
      uVar14 = 2;
      next = local_40;
    }
    else {
      lVar10 = LZMA_PROG_ERROR;
LAB_0018ff96:
      worker_error((worker_thread *)thr_ptr,lVar10);
      uVar14 = 3;
      next = local_40;
    }
  }
LAB_00190048:
  if (uVar14 == 4) {
    mythread_mutex_destroy(mutex);
    mythread_cond_destroy(cond);
    lzma_next_end(next,*(lzma_allocator **)((long)thr_ptr + 0x28));
    lzma_free(*(void **)((long)thr_ptr + 8),*(lzma_allocator **)((long)thr_ptr + 0x28));
    return (void *)0x0;
  }
LAB_00190052:
  mythread_mutex_lock(mutex);
  if (*thr_ptr != 4) {
    *(undefined4 *)thr_ptr = 0;
    mythread_cond_signal(cond);
  }
  mythread_mutex_unlock(mutex);
  mythread_mutex_lock((mythread_mutex *)(*(long *)((long)thr_ptr + 0x20) + 0x168));
  lVar2 = *(long *)((long)thr_ptr + 0x18);
  *(bool *)(lVar2 + 0x20) = uVar14 == 2;
  lVar6 = *(long *)((long)thr_ptr + 0x20);
  *(long *)(lVar6 + 0x158) = *(long *)(lVar6 + 0x158) + *(long *)(lVar2 + 0x18);
  *(long *)(lVar6 + 0x160) = *(long *)(lVar6 + 0x160) + *(long *)(lVar2 + 8);
  *local_48 = 0;
  local_48[1] = 0;
  *(undefined8 *)((long)thr_ptr + 0x158) = *(undefined8 *)(lVar6 + 0x148);
  *(void **)(lVar6 + 0x148) = thr_ptr;
  mythread_cond_signal((mythread_cond *)(lVar6 + 400));
  mythread_mutex_unlock((mythread_mutex *)(*(long *)((long)thr_ptr + 0x20) + 0x168));
LAB_001900ec:
  bVar13 = (bool)(bVar13 ^ 1);
  goto LAB_0018fd4c;
}

Assistant:

static MYTHREAD_RET_TYPE
worker_start(void *thr_ptr)
{
	worker_thread *thr = thr_ptr;
	worker_state state = THR_IDLE; // Init to silence a warning

	while (true) {
		// Wait for work.
		mythread_sync(thr->mutex) {
			while (true) {
				// The thread is already idle so if we are
				// requested to stop, just set the state.
				if (thr->state == THR_STOP) {
					thr->state = THR_IDLE;
					mythread_cond_signal(&thr->cond);
				}

				state = thr->state;
				if (state != THR_IDLE)
					break;

				mythread_cond_wait(&thr->cond, &thr->mutex);
			}
		}

		assert(state != THR_IDLE);
		assert(state != THR_STOP);

		if (state <= THR_FINISH)
			state = worker_encode(thr, state);

		if (state == THR_EXIT)
			break;

		// Mark the thread as idle unless the main thread has
		// told us to exit. Signal is needed for the case
		// where the main thread is waiting for the threads to stop.
		mythread_sync(thr->mutex) {
			if (thr->state != THR_EXIT) {
				thr->state = THR_IDLE;
				mythread_cond_signal(&thr->cond);
			}
		}

		mythread_sync(thr->coder->mutex) {
			// Mark the output buffer as finished if
			// no errors occurred.
			thr->outbuf->finished = state == THR_FINISH;

			// Update the main progress info.
			thr->coder->progress_in
					+= thr->outbuf->uncompressed_size;
			thr->coder->progress_out += thr->outbuf->size;
			thr->progress_in = 0;
			thr->progress_out = 0;

			// Return this thread to the stack of free threads.
			thr->next = thr->coder->threads_free;
			thr->coder->threads_free = thr;

			mythread_cond_signal(&thr->coder->cond);
		}
	}

	// Exiting, free the resources.
	mythread_mutex_destroy(&thr->mutex);
	mythread_cond_destroy(&thr->cond);

	lzma_next_end(&thr->block_encoder, thr->allocator);
	lzma_free(thr->in, thr->allocator);
	return MYTHREAD_RET_VALUE;
}